

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.cc
# Opt level: O0

int main(void)

{
  RandomDataProvider *pRVar1;
  uchar local_5c;
  char local_5b;
  char local_5a;
  char local_59;
  uchar buf [4];
  BogusRandomDataProvider brdp;
  SecureRandomDataProvider srdp;
  undefined1 local_38 [8];
  InsecureRandomDataProvider irdp;
  long r2;
  long r1;
  RandomDataProvider *orig_rdp;
  
  orig_rdp._4_4_ = 0;
  r1 = (long)QUtil::getRandomDataProvider();
  r2 = QUtil::random();
  irdp._8_8_ = QUtil::random();
  if (r2 == irdp._8_8_) {
    std::operator<<((ostream *)&std::cout,"fail: two randoms were the same\n");
  }
  InsecureRandomDataProvider::InsecureRandomDataProvider((InsecureRandomDataProvider *)local_38);
  InsecureRandomDataProvider::provideRandomData
            ((InsecureRandomDataProvider *)local_38,(uchar *)&r2,4);
  InsecureRandomDataProvider::provideRandomData
            ((InsecureRandomDataProvider *)local_38,&irdp.seeded_random,4);
  if (r2 == irdp._8_8_) {
    std::operator<<((ostream *)&std::cout,"fail: two insecure randoms were the same\n");
  }
  SecureRandomDataProvider::SecureRandomDataProvider((SecureRandomDataProvider *)&brdp);
  SecureRandomDataProvider::provideRandomData((SecureRandomDataProvider *)&brdp,(uchar *)&r2,4);
  SecureRandomDataProvider::provideRandomData
            ((SecureRandomDataProvider *)&brdp,&irdp.seeded_random,4);
  if (r2 == irdp._8_8_) {
    std::operator<<((ostream *)&std::cout,"fail: two secure randoms were the same\n");
  }
  BogusRandomDataProvider::BogusRandomDataProvider
            ((BogusRandomDataProvider *)&stack0xffffffffffffffa8);
  QUtil::setRandomDataProvider((RandomDataProvider *)&stack0xffffffffffffffa8);
  pRVar1 = QUtil::getRandomDataProvider();
  if (pRVar1 != (RandomDataProvider *)&stack0xffffffffffffffa8) {
    std::operator<<((ostream *)&std::cout,
                    "fail: getRandomDataProvider didn\'t return our provider\n");
  }
  r2 = QUtil::random();
  irdp._8_8_ = QUtil::random();
  if (r2 != irdp._8_8_) {
    std::operator<<((ostream *)&std::cout,"fail: two bogus randoms were different\n");
  }
  QUtil::initializeWithRandomBytes(&local_5c,4);
  if ((((local_5c != '\0') || (local_5b != '\x01')) || (local_5a != '\x02')) || (local_59 != '\x03')
     ) {
    std::operator<<((ostream *)&std::cout,"fail: bogus random didn\'t provide correct bytes\n");
  }
  QUtil::setRandomDataProvider((RandomDataProvider *)0x0);
  pRVar1 = QUtil::getRandomDataProvider();
  if (pRVar1 != (RandomDataProvider *)r1) {
    std::operator<<((ostream *)&std::cout,
                    "fail: passing null to setRandomDataProvider didn\'t reset the random data provider\n"
                   );
  }
  std::operator<<((ostream *)&std::cout,"random: end of tests\n");
  orig_rdp._4_4_ = 0;
  BogusRandomDataProvider::~BogusRandomDataProvider
            ((BogusRandomDataProvider *)&stack0xffffffffffffffa8);
  SecureRandomDataProvider::~SecureRandomDataProvider((SecureRandomDataProvider *)&brdp);
  InsecureRandomDataProvider::~InsecureRandomDataProvider((InsecureRandomDataProvider *)local_38);
  return orig_rdp._4_4_;
}

Assistant:

int
main()
{
    RandomDataProvider* orig_rdp = QUtil::getRandomDataProvider();
    long r1 = QUtil::random();
    long r2 = QUtil::random();
    if (r1 == r2) {
        std::cout << "fail: two randoms were the same\n";
    }
    InsecureRandomDataProvider irdp;
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    irdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two insecure randoms were the same\n";
    }
#ifndef SKIP_OS_SECURE_RANDOM
    SecureRandomDataProvider srdp;
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r1), 4);
    srdp.provideRandomData(reinterpret_cast<unsigned char*>(&r2), 4);
    if (r1 == r2) {
        std::cout << "fail: two secure randoms were the same\n";
    }
#endif
    BogusRandomDataProvider brdp;
    QUtil::setRandomDataProvider(&brdp);
    if (QUtil::getRandomDataProvider() != &brdp) {
        std::cout << "fail: getRandomDataProvider didn't"
                     " return our provider\n";
    }
    r1 = QUtil::random();
    r2 = QUtil::random();
    if (r1 != r2) {
        std::cout << "fail: two bogus randoms were different\n";
    }
    unsigned char buf[4];
    QUtil::initializeWithRandomBytes(buf, 4);
    if (!((buf[0] == 0) && (buf[1] == 1) && (buf[2] == 2) && (buf[3] == 3))) {
        std::cout << "fail: bogus random didn't provide correct bytes\n";
    }
    QUtil::setRandomDataProvider(nullptr);
    if (QUtil::getRandomDataProvider() != orig_rdp) {
        std::cout << "fail: passing null to setRandomDataProvider "
                     "didn't reset the random data provider\n";
    }
    std::cout << "random: end of tests\n";
    return 0;
}